

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::internal::write_exponent<char,char*>(int exp,char *it)

{
  ulong uVar1;
  char *pcVar2;
  char *unaff_retaddr;
  
  if (exp + 9999U < 19999) {
    if (exp < 0) {
      *it = '-';
      exp = -exp;
    }
    else {
      *it = '+';
    }
    pcVar2 = it + 1;
    if (99 < exp) {
      uVar1 = (ulong)(uint)exp;
      if (999 < exp) {
        it[1] = basic_data<void>::digits[(uVar1 / 100) * 2];
        pcVar2 = it + 2;
      }
      exp = (uint)exp % 100;
      *pcVar2 = basic_data<void>::digits[(uVar1 / 100) * 2 + 1];
      pcVar2 = pcVar2 + 1;
    }
    *(undefined2 *)pcVar2 = *(undefined2 *)(basic_data<void>::digits + (ulong)(uint)exp * 2);
    return pcVar2 + 2;
  }
  assert_fail(unaff_retaddr,0,(char *)(ulong)(exp + 9999U));
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}